

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O1

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::ComputeSolutionKernelHdivT<double>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZMaterialDataT<double> *data)

{
  TPZSolVec<double> *sol;
  TPZManVector<double,_10> *pTVar1;
  TPZFNMatrix<30,_double> *pTVar2;
  int iVar3;
  long *plVar4;
  TPZCompMesh *pTVar5;
  TPZFMatrix<double> *pTVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double local_58;
  TPZManVector<TPZManVector<double,_10>,_20> *local_50;
  TPZManVector<TPZManVector<double,_10>,_20> *local_48;
  long local_40;
  long local_38;
  
  sol = &data->sol;
  local_50 = &data->curlsol;
  TPZCompElHCurl<pzshape::TPZShapePrism>::ComputeSolutionHCurlT<double>
            (&this->super_TPZCompElHCurl<pzshape::TPZShapePrism>,
             &(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,
             &(data->super_TPZMaterialData).curlphi.super_TPZFMatrix<double>,sol,local_50);
  plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).
                                          super_TPZIntelGen<pzshape::TPZShapePrism>.
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  iVar3 = (**(code **)(*plVar4 + 0x78))(plVar4);
  (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).
                         super_TPZIntelGen<pzshape::TPZShapePrism>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x90))(this);
  pTVar5 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar5->fSolution);
  if ((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol == 1) {
    local_48 = sol;
    TPZManVector<TPZManVector<double,_10>,_20>::Resize(sol,1);
    TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(&data->dsol,1);
    TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->divsol,1);
    lVar7 = (long)(iVar3 * 3);
    local_38 = (long)iVar3;
    lVar10 = 0;
    lVar8 = 0;
    lVar9 = 1;
    local_40 = lVar7;
    do {
      pTVar1 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
      (**(code **)(*(long *)((long)pTVar1->fExtAlloc + lVar8 + -0x20) + 0x18))
                ((long)pTVar1->fExtAlloc + lVar8 + -0x20,lVar7);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
                 lVar8 + -0x20),&local_58,0,-1);
      pTVar2 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
      (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                     (&((TPZFMatrix<double> *)
                                       (&(pTVar2->super_TPZFMatrix<double>).fPivot + -1))->fPivot +
                                     -1))->fPivot + 0xffffffffffffffff) + lVar10) + 0x70))
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)(&(pTVar2->super_TPZFMatrix<double>).fPivot + -1))
                           ->fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar10,lVar7,3);
      pTVar1 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
      (**(code **)(*(long *)((long)pTVar1->fExtAlloc + lVar8 + -0x20) + 0x18))
                ((long)pTVar1->fExtAlloc + lVar8 + -0x20,local_38);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
                 lVar8 + -0x20),&local_58,0,-1);
      lVar8 = lVar8 + 0x70;
      lVar10 = lVar10 + 0x188;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    TPZManVector<TPZManVector<double,_10>,_20>::operator=(local_48,local_50);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
             ,0xaf);
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}